

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perf_test.cpp
# Opt level: O2

void atomic_inc_acq_rel(size_t COUNT)

{
  long lVar1;
  ostream *poVar2;
  long lVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  uint64_t c;
  
  lVar3 = 0x10000000;
  lVar1 = std::chrono::_V2::system_clock::now();
  while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
    LOCK();
    UNLOCK();
  }
  lVar3 = std::chrono::_V2::system_clock::now();
  dVar5 = (double)(lVar3 - lVar1) / 1000000000.0;
  dVar6 = dVar5 * 1000.0 * 1000.0 * 1000.0 * 3.725290298461914e-09;
  expand_name("atomic_inc_acq_rel");
  poVar2 = std::operator<<((ostream *)&std::cout,expand_name::buf);
  std::operator<<(poVar2,": ");
  poVar2 = std::ostream::_M_insert<double>(dVar6);
  std::operator<<(poVar2,"ns per operation,\t");
  poVar2 = std::ostream::_M_insert<double>(dVar6 / unit);
  std::operator<<(poVar2," ticks,\t");
  poVar2 = std::ostream::_M_insert<double>(((268435456.0 / dVar5) / 1000.0) / 1000.0);
  poVar2 = std::operator<<(poVar2," Mrps");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

static void __attribute__((noinline))
atomic_inc_acq_rel(const size_t COUNT = 0x10000000)
{
    uint64_t c;
    now_t start = now();
    for (size_t i = 0; i < COUNT; i++)
    {
        __atomic_add_fetch(&c, 1, __ATOMIC_ACQ_REL);
    }
    now_t stop = now();

    std::chrono::duration<double> diff = stop - start;
    double ns_per_op = diff.count() * 1000 * 1000 * 1000 / COUNT;
    double Mrps = COUNT / diff.count() / 1000 / 1000;
    std::cout << NAME << ": " << ns_per_op << "ns per operation,\t"
              << (ns_per_op / unit) << " ticks,\t"
              << Mrps << " Mrps" << std::endl;
}